

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.hpp
# Opt level: O0

HVector * __thiscall Basis::vec2hvec(Basis *this,QpVector *vec)

{
  value_type vVar1;
  value_type vVar2;
  const_reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  vector<double,_std::allocator<double>_> *this_00;
  reference pvVar6;
  int *in_RSI;
  HVectorBase<double> *in_RDI;
  HighsInt i;
  int local_14;
  
  HVectorBase<double>::clear(in_RDI);
  for (local_14 = 0; local_14 < *in_RSI; local_14 = local_14 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_14);
    vVar2 = *pvVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index,(long)local_14);
    *pvVar4 = vVar2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_14);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),(long)*pvVar3);
    vVar1 = *pvVar5;
    this_00 = &in_RDI->array;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_14);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar3);
    *pvVar6 = vVar1;
  }
  in_RDI->count = *in_RSI;
  in_RDI->packFlag = true;
  return in_RDI;
}

Assistant:

HVector& vec2hvec(const QpVector& vec) {
    buffer_vec2hvec.clear();
    for (HighsInt i = 0; i < vec.num_nz; i++) {
      buffer_vec2hvec.index[i] = vec.index[i];
      buffer_vec2hvec.array[vec.index[i]] = vec.value[vec.index[i]];
    }
    buffer_vec2hvec.count = vec.num_nz;
    buffer_vec2hvec.packFlag = true;
    return buffer_vec2hvec;
  }